

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

size_t ByteStreamToBase32(uint8_t *inBuf,size_t len,char *outBuf,size_t outLen)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (outLen == 0) {
    return 0;
  }
  uVar6 = (uint)*inBuf;
  uVar7 = 1;
  iVar3 = 8;
  sVar2 = 0;
  do {
    if (len <= uVar7 && iVar3 < 1) {
      return sVar2;
    }
    if (iVar3 < 5) {
      if (uVar7 < len) {
        uVar6 = uVar6 << 8 | (uint)inBuf[uVar7];
        uVar7 = uVar7 + 1;
        iVar3 = iVar3 + 8;
      }
      else {
        uVar6 = uVar6 << (5U - (char)iVar3 & 0x1f);
        iVar3 = 5;
      }
    }
    iVar3 = iVar3 + -5;
    uVar5 = (int)uVar6 >> ((byte)iVar3 & 0x1f) & 0x1f;
    cVar1 = (char)uVar5;
    cVar4 = cVar1 + 'a';
    if (0x19 < uVar5) {
      cVar4 = cVar1 + '\x18';
    }
    outBuf[sVar2] = cVar4;
    sVar2 = sVar2 + 1;
  } while (outLen != sVar2);
  return outLen;
}

Assistant:

size_t ByteStreamToBase32 (const uint8_t * inBuf, size_t len, char * outBuf, size_t outLen)
	{
		size_t ret = 0, pos = 1;
		int bits = 8, tmp = inBuf[0];
		while (ret < outLen && (bits > 0 || pos < len))
		{
			if (bits < 5)
			{
				if (pos < len)
				{
					tmp <<= 8;
					tmp |= inBuf[pos] & 0xFF;
					pos++;
					bits += 8;
				}
				else // last byte
				{
					tmp <<= (5 - bits);
					bits = 5;
				}
			}

			bits -= 5;
			int ind = (tmp >> bits) & 0x1F;
			outBuf[ret] = (ind < 26) ? (ind + 'a') : ((ind - 26) + '2');
			ret++;
		}
		return ret;
	}